

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_end.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::
scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/upnp.cpp:481:35)>
::~scope_end_impl(scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
                  *this)

{
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
  *this_local;
  
  if ((this->m_armed & 1U) != 0) {
    anon_class_16_2_d7082ac2_for_m_fun::operator()(&this->m_fun);
  }
  return;
}

Assistant:

~scope_end_impl() { if (m_armed) m_fun(); }